

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint match_extra;
  uint match_slot;
  
  uVar2 = *(uint *)((long)&g_prob_cost +
                   (ulong)(0x800 - this->m_is_match_model[is_match_model_index].m_bit_0_prob) * 4);
  uVar4 = *(uint *)((long)&g_prob_cost +
                   (ulong)this->m_is_rep_model[(this->super_state_base).m_cur_state].m_bit_0_prob *
                   4);
  _match_extra = in_RAX;
  CLZBase::compute_lzx_position_slot(lzbase,match_dist,&match_slot,&match_extra);
  bVar1 = *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)match_slot);
  if (bVar1 < 3) {
    lVar6 = (ulong)bVar1 << 0x18;
  }
  else {
    uVar3 = 0;
    if (4 < bVar1) {
      uVar3 = (ulong)((uint)bVar1 * 0x1000000 + 0xfc000000);
    }
    lVar6 = (ulong)*(byte *)(*(long *)&this->field_0x4f8 + (ulong)(match_extra & 0xf)) * 0x1000000 +
            uVar3;
  }
  lVar6 = (ulong)uVar4 + (ulong)uVar2 + lVar6;
  uVar2 = (this->super_state_base).m_cur_state;
  uVar4 = min_len - 0x102;
  for (uVar3 = (ulong)min_len; (long)uVar3 <= (long)max_len; uVar3 = uVar3 + 1) {
    if ((long)uVar3 < 9) {
      uVar7 = uVar4 + 0x100;
      lVar5 = lVar6;
    }
    else {
      if (uVar3 < 0x102) {
        lVar5 = (ulong)*(byte *)(*(long *)(&this->field_0x3d8 + (ulong)(6 < uVar2) * 0x90) + -9 +
                                uVar3) * 0x1000000 + lVar6;
      }
      else {
        lVar5 = 9;
        if ((0xff < uVar4) && (lVar5 = 0xc, 0x4ff < uVar4)) {
          lVar5 = (ulong)(0x14ff < uVar4) * 4 + 0xf;
        }
        lVar5 = lVar5 + lVar6 +
                (ulong)*(byte *)(*(long *)(&this->field_0x3d8 + (ulong)(6 < uVar2) * 0x90) + 0xf9) *
                0x1000000;
      }
      uVar7 = 7;
    }
    pBitcosts[uVar3] =
         (ulong)*(byte *)(*(long *)&this->field_0x228 + (ulong)((uVar7 | match_slot * 8 - 8) + 2)) *
         0x1000000 + lVar5;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      LZHAM_NOTE_UNUSED(dict_pos);
      LZHAM_ASSERT(min_len >= CLZBase::cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const quasi_adaptive_huffman_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            if (match_len > CLZBase::cMaxMatchLen)
            {
               len_cost += get_huge_match_code_len(match_len) + large_len_table.get_cost((CLZBase::cMaxMatchLen + 1) - 9);
            }
            else
            {
               len_cost += large_len_table.get_cost(match_len - 9);
            }
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }